

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O0

IdentPtr __thiscall HashTbl::PidFromTk(HashTbl *this,tokens token)

{
  StaticSym *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  StaticSym *sym;
  IdentPtr rpid;
  tokens token_local;
  HashTbl *this_local;
  
  if (((int)token < 1) || (0x4d < (int)token)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0xdb,"(token > tkNone && token < tkID)","token > tkNone && token < tkID");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  sym = (StaticSym *)this->m_rpid[token];
  if ((IdentPtr)sym == (IdentPtr)0x0) {
    pSVar1 = s_reservedWordInfo[token].sym;
    if (pSVar1 == (StaticSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                         ,0xe2,"(sym != nullptr)","sym != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    sym = (StaticSym *)
          PidHashNameLenWithHash<char16_t>
                    (this,(char16_t *)(pSVar1 + 1),
                     (char16_t *)((long)&pSVar1[1].luHash + (ulong)pSVar1->cch * 2),pSVar1->cch,
                     pSVar1->luHash);
    Ident::SetTk((Ident *)sym,token,s_reservedWordInfo[token].grfid);
    this->m_rpid[token] = (IdentPtr)sym;
  }
  return (IdentPtr)sym;
}

Assistant:

IdentPtr HashTbl::PidFromTk(tokens token)
{
    Assert(token > tkNone && token < tkID);
    __analysis_assume(token > tkNone && token < tkID);
    // Create a pid so we can create a name node
    IdentPtr rpid = m_rpid[token];
    if (nullptr == rpid)
    {
        StaticSym const * sym = s_reservedWordInfo[token].sym;
        Assert(sym != nullptr);
        rpid = this->PidHashNameLenWithHash(sym->sz, sym->sz + sym->cch, sym->cch, sym->luHash);
        rpid->SetTk(token, s_reservedWordInfo[token].grfid);
        m_rpid[token] = rpid;
    }
    return rpid;
}